

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O1

int proto_action_in_stage(proto_action *act,action_class stage)

{
  byte bVar1;
  
  switch(stage) {
  case Immediate_and_Multi:
    bVar1 = 1;
    if (act->action_type == Action_Multi) break;
  case Immediate:
    if (act->action_type < Action_Congestion) {
      bVar1 = (byte)(0x638 >> ((byte)act->action_type & 0x1f));
    }
    else {
      bVar1 = 0;
    }
    break;
  case Bridge:
    bVar1 = act->action_type == Action_Bridge;
    break;
  case Congestion:
    bVar1 = act->action_type == Action_Congestion;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                  ,0x49a,"int proto_action_in_stage(proto_action *, action_class)");
  }
  return bVar1 & 1;
}

Assistant:

static int
proto_action_in_stage(proto_action *act, action_class stage) {
    switch (stage) {
    case Immediate_and_Multi:
        if (act->action_type == Action_Multi) return 1;
        /* fallthrough */
    case Immediate:
        switch (act->action_type) {
        case Action_Terminal:
        case Action_Filter:
        case Action_Split:
        case Action_Immediate:
        case Action_Store:
            return 1;
        default:
            return 0;
        }
    case Bridge:
        return act->action_type == Action_Bridge;
    case Congestion:
        return act->action_type == Action_Congestion;
    default:
        assert(0);
    }
    return 0;
}